

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O0

Path<SimpleState_*> *
xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal,
          CalcHeuristicFunc_t<SimpleState_*,_double> *calc_heuristic)

{
  bool bVar1;
  function<double_(SimpleState_*,_SimpleState_*)> *in_RSI;
  Path<SimpleState_*> *in_RDI;
  vertex_iterator *wp;
  iterator __end0;
  iterator __begin0;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *__range3;
  GetNeighbourFunc_t<SimpleState_*,_double> *in_stack_00000088;
  CalcHeuristicFunc_t<SimpleState_*,_double> *in_stack_00000090;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_00000098;
  vertex_iterator in_stack_000000a0;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  in_stack_000000a8;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  vertex_iterator goal_it;
  vertex_iterator start_it;
  Path<SimpleState_*> *path;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
  *this;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_fffffffffffffee8;
  function<double_(SimpleState_*,_SimpleState_*)> *__x;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  in_stack_fffffffffffffef0;
  bool local_101;
  __normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
  local_d0;
  undefined1 *local_c8;
  function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
  local_c0 [2];
  __node_type *local_80;
  __node_type *local_78;
  undefined1 local_70 [24];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_58 [3];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_40;
  undefined1 local_31;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  local_28 [3];
  function<double_(SimpleState_*,_SimpleState_*)> *local_10;
  
  local_10 = in_RSI;
  Graph<SimpleState_*,_double,_SimpleStateIndexer>::ResetAllVertices
            ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)in_stack_fffffffffffffef0._M_cur);
  local_28[0]._M_cur =
       (__node_type *)
       Graph<SimpleState_*,_double,_SimpleStateIndexer>::FindVertex
                 (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_30._M_cur =
       (__node_type *)
       Graph<SimpleState_*,_double,_SimpleStateIndexer>::FindVertex
                 (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_31 = 0;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::vector
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)0x102748);
  local_40._M_cur =
       (__node_type *)
       Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_end(in_stack_fffffffffffffed8);
  bVar1 = std::__detail::operator!=(local_28,&local_40);
  local_101 = false;
  if (bVar1) {
    in_stack_fffffffffffffef0._M_cur =
         (__node_type *)
         Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_end(in_stack_fffffffffffffed8);
    local_58[0]._M_cur = in_stack_fffffffffffffef0._M_cur;
    local_101 = std::__detail::operator!=(&local_30,local_58);
  }
  if (local_101 != false) {
    local_78 = local_28[0]._M_cur;
    local_80 = local_30._M_cur;
    std::function<double_(SimpleState_*,_SimpleState_*)>::function
              ((function<double_(SimpleState_*,_SimpleState_*)> *)in_stack_fffffffffffffef0._M_cur,
               local_10);
    this = local_c0;
    std::
    function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
    ::function(this,in_stack_fffffffffffffed8);
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              (in_stack_00000098,(vertex_iterator)in_stack_000000a8._M_cur,in_stack_000000a0,
               in_stack_00000090,in_stack_00000088);
    std::
    function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
    ::~function((function<std::vector<std::tuple<SimpleState_*,_double>,_std::allocator<std::tuple<SimpleState_*,_double>_>_>_(SimpleState_*)>
                 *)0x102863);
    std::function<double_(SimpleState_*,_SimpleState_*)>::~function
              ((function<double_(SimpleState_*,_SimpleState_*)> *)0x102870);
    local_c8 = local_70;
    local_d0._M_current =
         (vertex_iterator *)
         std::
         vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
         ::begin((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                  *)in_stack_fffffffffffffed8);
    std::
    vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::end((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           *)in_stack_fffffffffffffed8);
    __x = local_10;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
                               *)this,(__normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
                                       *)in_stack_fffffffffffffed8), bVar1) {
      __gnu_cxx::
      __normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
      ::operator*(&local_d0);
      Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator::operator->
                ((vertex_iterator *)0x1028cc);
      std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::push_back
                ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)
                 in_stack_fffffffffffffef0._M_cur,(value_type *)__x);
      __gnu_cxx::
      __normal_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator_*,_std::vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>_>
      ::operator++(&local_d0);
    }
    std::
    vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::~vector((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               *)in_stack_fffffffffffffef0._M_cur);
  }
  return in_RDI;
}

Assistant:

static Path<State> Search(
      Graph<State, Transition, StateIndexer> *graph, VertexIdentifier start,
      VertexIdentifier goal,
      CalcHeuristicFunc_t<State, Transition> calc_heuristic) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it, calc_heuristic);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }